

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_av1.c
# Opt level: O1

uint aom_highbd_obmc_sad8x8_c(uint8_t *ref,int ref_stride,int32_t *wsrc,int32_t *mask)

{
  int *piVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  
  lVar9 = (long)ref * 2;
  uVar11 = 0;
  iVar10 = 0;
  do {
    iVar12 = 0;
    iVar13 = 0;
    iVar14 = 0;
    lVar8 = 0;
    do {
      piVar1 = wsrc + lVar8;
      uVar2 = *(ulong *)(lVar9 + lVar8 * 2);
      auVar4._8_4_ = 0;
      auVar4._0_8_ = uVar2;
      auVar4._12_2_ = (short)(uVar2 >> 0x30);
      auVar5._8_2_ = (short)(uVar2 >> 0x20);
      auVar5._0_8_ = uVar2;
      auVar5._10_4_ = auVar4._10_4_;
      auVar7._6_8_ = 0;
      auVar7._0_6_ = auVar5._8_6_;
      auVar6._4_2_ = (short)(uVar2 >> 0x10);
      auVar6._0_4_ = (uint)uVar2;
      auVar6._6_8_ = SUB148(auVar7 << 0x40,6);
      auVar3 = *(undefined1 (*) [16])(mask + lVar8);
      uVar15 = *piVar1 - auVar3._0_4_ * ((uint)uVar2 & 0xffff);
      uVar16 = piVar1[1] - auVar6._4_4_ * auVar3._4_4_;
      uVar17 = piVar1[2] - (int)((auVar3._8_8_ & 0xffffffff) * ((ulong)auVar5._8_6_ & 0xffffffff));
      uVar18 = piVar1[3] - (auVar4._10_4_ >> 0x10) * auVar3._12_4_;
      uVar19 = (int)uVar15 >> 0x1f;
      uVar20 = (int)uVar16 >> 0x1f;
      uVar21 = (int)uVar17 >> 0x1f;
      uVar22 = (int)uVar18 >> 0x1f;
      uVar11 = uVar11 + (((uVar15 ^ uVar19) - uVar19) + 0x800 >> 0xc);
      iVar12 = iVar12 + (((uVar16 ^ uVar20) - uVar20) + 0x800 >> 0xc);
      iVar13 = iVar13 + (((uVar17 ^ uVar21) - uVar21) + 0x800 >> 0xc);
      iVar14 = iVar14 + (((uVar18 ^ uVar22) - uVar22) + 0x800 >> 0xc);
      lVar8 = lVar8 + 4;
    } while (lVar8 != 8);
    uVar11 = iVar14 + iVar12 + iVar13 + uVar11;
    wsrc = wsrc + 8;
    mask = mask + 8;
    iVar10 = iVar10 + 1;
    lVar9 = lVar9 + (long)ref_stride * 2;
  } while (iVar10 != 8);
  return uVar11;
}

Assistant:

static inline unsigned int highbd_obmc_sad(
                                const uint8_t *pre8, int pre_stride,
                                const int32_t *wsrc, const int32_t *mask,
                                int width, int height) {
  int y, x;
  unsigned int sad = 0;
  const uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++)
      sad += ROUND_POWER_OF_TWO(abs(wsrc[x] - pre[x] * mask[x]), 12);

    pre += pre_stride;
    wsrc += width;
    mask += width;
  }

  return sad;
}